

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_skip_constant(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  char *k;
  char c;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  end_local = buf;
  do {
    while( true ) {
      while( true ) {
        if (end_local == end) {
          return end_local;
        }
        bVar1 = *end_local;
        if ((((((int)(char)bVar1 & 0x80U) == 0) && (bVar1 != 0x5f)) &&
            (((char)bVar1 < '0' || ('9' < (char)bVar1)))) && (bVar1 != 0x2e)) break;
        end_local = end_local + 1;
      }
      if (((char)(bVar1 | 0x20) < 'a') || ('z' < (char)(bVar1 | 0x20))) break;
      end_local = end_local + 1;
    }
    pcVar2 = flatcc_json_parser_space(ctx,end_local,end);
    bVar3 = pcVar2 != end_local;
    end_local = pcVar2;
  } while (bVar3);
  return pcVar2;
}

Assistant:

const char *flatcc_json_parser_skip_constant(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    char c;
    const char *k;

    while (buf != end) {
        c = *buf;
        if ((c & 0x80) || (c == '_') || (c >= '0' && c <= '9') || c == '.') {
            ++buf;
            continue;
        }
        /* Upper case. */
        c |= 0x20;
        if (c >= 'a' && c <= 'z') {
            ++buf;
            continue;
        }
        buf = flatcc_json_parser_space(ctx, (k = buf), end);
        if (buf == k) {
            return buf;
        }
    }
    return buf;
}